

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::MidiFile(MidiFile *this)

{
  MidiEventList *this_00;
  reference ppMVar1;
  int local_20;
  int i;
  MidiFile *this_local;
  
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::vector(&this->m_events);
  this->m_ticksPerQuarterNote = 0x78;
  this->m_trackCount = 1;
  this->m_theTrackState = 0;
  this->m_theTimeState = 1;
  std::__cxx11::string::string((string *)&this->m_readFileName);
  this->m_timemapvalid = false;
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::vector(&this->m_timemap);
  this->m_rwstatus = true;
  this->m_linkedEventsQ = false;
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,(long)this->m_trackCount);
  for (local_20 = 0; local_20 < this->m_trackCount; local_20 = local_20 + 1) {
    this_00 = (MidiEventList *)operator_new(0x18);
    MidiEventList::MidiEventList(this_00);
    ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)local_20);
    *ppMVar1 = this_00;
  }
  return;
}

Assistant:

MidiFile::MidiFile(void) {
	m_events.resize(m_trackCount);
	for (int i=0; i<m_trackCount; i++) {
		m_events[i] = new MidiEventList;
	}
}